

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_udev.cc
# Opt level: O2

void __thiscall
ccel::udev::virtual_keyboard_handler::virtual_keyboard_handler
          (virtual_keyboard_handler *this,io_service *io,string *dev_name,int flags)

{
  uinput_user_dev *__s;
  int iVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ssize_t sVar3;
  runtime_error *this_00;
  uint i;
  uint uVar4;
  emplace_return eVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  base_handler::base_handler(&this->super_base_handler,io,0x4e8);
  (this->super_base_handler)._vptr_base_handler = (_func_int **)&PTR_open_00129778;
  boost::unordered::
  unordered_map<int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>_>
  ::unordered_map(&this->__key_proprety);
  __s = &this->_udev;
  memset(__s,0,0x45c);
  std::__cxx11::string::string((string *)&this->_dev_name,(string *)dev_name);
  this->_open = true;
  iVar1 = ::open("/dev/uinput",flags);
  this->_fd = iVar1;
  ioctl(iVar1,0x40045565,0x39);
  iVar1 = 0;
  while (uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38), iVar1 < 0xf8) {
    ioctl(this->_fd,0x40045565);
    eVar5 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<int_const,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,int,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,boost::hash<int>,std::equal_to<int>>>
            ::try_emplace_unique<int_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,int,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,boost::hash<int>,std::equal_to<int>>>
                        *)&this->__key_proprety,(int *)((long)&uStack_38 + 4));
    ((eVar5.first.node_.node_)->value_base_).data_.data_.buf[4] = '\0';
    *(undefined4 *)((long)&((eVar5.first.node_.node_)->value_base_).data_.data_ + 8) = 0x14;
    iVar1 = uStack_38._4_4_ + 1;
  }
  ioctl(this->_fd,0x40045564,1);
  ioctl(this->_fd,0x40045564,2);
  for (uVar4 = 0; uVar2 = (ulong)uVar4, uVar2 < (this->_dev_name)._M_string_length;
      uVar4 = uVar4 + 1) {
    __s->name[uVar2] = (this->_dev_name)._M_dataplus._M_p[uVar2];
  }
  (this->_udev).id.bustype = 3;
  (this->_udev).id.vendor = 1;
  (this->_udev).id.product = 1;
  (this->_udev).id.version = 1;
  sVar3 = write(this->_fd,__s,0x45c);
  if (sVar3 < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Write uinput file descriptor failed.");
  }
  else {
    iVar1 = ioctl(this->_fd,0x5501);
    if (iVar1 == 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Create virtual keyboard failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual_keyboard_handler::virtual_keyboard_handler(boost::asio::io_service &io,
                                                   const std::string dev_name,
                                                   const int flags)
    : base_handler(io, sizeof(virtual_keyboard_handler)), _udev{},
      _dev_name{dev_name}, _open(true) {
  // Init the udev handler
  // Open the uinput file descriptor
  _fd = ::open("/dev/uinput", flags);
  // NOTICE THAT THIS IS NOT ccel::base_handler::open()
  ioctl(_fd, UI_SET_KEYBIT, KEY_SPACE);
  for (auto i = 0; i < 248; i++) {
    ioctl(_fd, UI_SET_KEYBIT, i); // Bind and allow keycodes from 0 to 248
    __key_proprety[i] =
        boost::make_tuple(false, 20); // Default click time in  20 ms
  }
  ioctl(_fd, UI_SET_EVBIT, EV_KEY);
  ioctl(_fd, UI_SET_EVBIT, EV_REL);

  for (unsigned i = 0; i < _dev_name.length(); i++) {
    _udev.name[i] = _dev_name[i];
  }
  _udev.id.bustype = BUS_USB;
  _udev.id.vendor = 0x1;
  _udev.id.product = 0x1;
  _udev.id.version = 1;
  if (write(_fd, &_udev, sizeof(_udev)) < 0)
    throw std::runtime_error("Write uinput file descriptor failed.");
  if (ioctl(_fd, UI_DEV_CREATE) != 0) {
    throw std::runtime_error("Create virtual keyboard failed.");
  };
}